

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O1

sexp_conflict sexp_get_environment_variables(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  char *__s;
  char *pcVar1;
  undefined8 *puVar2;
  sexp_conflict res;
  sexp_conflict val;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict local_70;
  sexp_conflict local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_58.var = &local_70;
  local_38.next = &local_58;
  local_38.var = &local_60;
  local_60 = (sexp_conflict)0x43e;
  local_48.next = &local_38;
  local_48.var = &local_68;
  local_68 = (sexp_conflict)0x43e;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  local_70 = (sexp_conflict)0x23e;
  __s = (char *)*_environ;
  puVar2 = _environ;
  while (__s != (char *)0x0) {
    puVar2 = puVar2 + 1;
    pcVar1 = strchr(__s,0x3d);
    if (pcVar1 != (char *)0x0) {
      local_60 = (sexp_conflict)sexp_c_string(ctx,__s,(long)pcVar1 - (long)__s);
      local_68 = (sexp_conflict)sexp_c_string(ctx,pcVar1 + 1,0xffffffffffffffff);
      local_68 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_60,local_68);
      local_70 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_68,local_70);
    }
    __s = (char *)*puVar2;
  }
  (ctx->value).context.saves = local_58.next;
  return local_70;
}

Assistant:

sexp sexp_get_environment_variables (sexp ctx, sexp self, sexp_sint_t n) {
  int i;
  char **env, *cname, *cval;
  sexp_gc_var3(res, name, val);
  sexp_gc_preserve3(ctx, res, name, val);
  res = SEXP_NULL;
#ifndef PLAN9
  env = environ;
  for (i=0; env[i]; i++) {
    cname = env[i];
    cval = strchr(cname, '=');
    if (cval) {
      name = sexp_c_string(ctx, cname, cval-cname);
      val = sexp_c_string(ctx, cval+1, -1);
      val = sexp_cons(ctx, name, val);
      res = sexp_cons(ctx, val, res);
    }
  }
#endif
  sexp_gc_release3(ctx);
  return res;
}